

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

bool __thiscall PPrototype::IsMatch(PPrototype *this,intptr_t id1,intptr_t id2)

{
  uint uVar1;
  TArray<PType_*,_PType_*> *args;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  uVar1 = *(uint *)(id1 + 0xc);
  if (uVar1 == (this->ArgumentTypes).Count) {
    if ((ulong)uVar1 != 0) {
      uVar3 = 0;
      do {
        if (*(PType **)(*(long *)id1 + uVar3 * 8) != (this->ArgumentTypes).Array[uVar3]) {
          return false;
        }
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    uVar1 = *(uint *)(id2 + 0xc);
    if (uVar1 == (this->ReturnTypes).Count) {
      if ((ulong)uVar1 == 0) {
        return true;
      }
      lVar2 = 0;
      do {
        bVar4 = *(PType **)(*(long *)id2 + lVar2 * 8) == (this->ReturnTypes).Array[lVar2];
        if (!bVar4) {
          return bVar4;
        }
        bVar5 = (ulong)uVar1 - 1 != lVar2;
        lVar2 = lVar2 + 1;
      } while (bVar5);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool operator==(const TArray<T> &other) const
	{
		if (Count != other.Count)
		{
			return false;
		}
		for (unsigned int i = 0; i < Count; ++i)
		{
			if (Array[i] != other.Array[i])
			{
				return false;
			}
		}
		return true;
	}